

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O2

IntrinsicResult MiniScript::intrinsic_val(Context *context,IntrinsicResult partialResult)

{
  Value val;
  Value local_58;
  Value local_48;
  Value local_38;
  String local_28;
  
  String::String(&local_28,"self");
  Context::GetVar((Context *)&val,(String *)partialResult.rs,(LocalOnlyMode)&local_28);
  String::~String(&local_28);
  if (val.type == String) {
    Value::GetString(&local_58);
    local_48.data.number = String::DoubleValue((String *)&local_58,"%lf");
    local_48.type = Number;
    local_48.noInvoke = false;
    local_48.localOnly = Off;
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_48,true);
    Value::~Value(&local_48);
    String::~String((String *)&local_58);
  }
  else if (val.type == Number) {
    local_38.type = Number;
    local_38.noInvoke = val.noInvoke;
    local_38.localOnly = val.localOnly;
    local_38.data = val.data;
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_38,true);
    Value::~Value(&local_38);
  }
  else {
    IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)context,(IntrinsicResult *)&IntrinsicResult::Null);
  }
  Value::~Value(&val);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_val(Context *context, IntrinsicResult partialResult) {
		Value val = context->GetVar("self");
		if (val.type == ValueType::Number) return IntrinsicResult(val);
		if (val.type == ValueType::String) return IntrinsicResult(val.GetString().DoubleValue());
		return IntrinsicResult::Null;
	}